

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::SchemaElement::read(SchemaElement *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  ssize_t sVar4;
  TProtocolException *this_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  int32_t ecast56;
  int32_t ecast55;
  int32_t ecast54;
  bool isset_name;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_ffffffffffffff08;
  TProtocolExceptionType in_stack_ffffffffffffff0c;
  TProtocol *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  uint32_t in_stack_ffffffffffffff20;
  uint32_t in_stack_ffffffffffffff24;
  type local_64;
  type local_60;
  type local_5c;
  undefined2 local_46;
  int local_44;
  string local_40 [36];
  uint local_1c;
  undefined8 local_10;
  SchemaElement *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)in_stack_ffffffffffffff10,
             (TProtocol *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    (in_stack_ffffffffffffff10,
                     (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_1c = uVar2 + local_1c;
  bVar1 = false;
  while( true ) {
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (TType *)in_stack_ffffffffffffff10,
                       (int16_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_1c = uVar2 + local_1c;
    if (local_44 == 0) break;
    switch(local_46) {
    case 1:
      if (local_44 == 8) {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          (in_stack_ffffffffffffff10,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        local_1c = uVar2 + local_1c;
        this->type = local_5c;
        this->__isset = (_SchemaElement__isset)((ushort)this->__isset & 0xfffe | 1);
      }
      else {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::skip
                          (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        local_1c = uVar2 + local_1c;
      }
      break;
    case 2:
      if (local_44 == 8) {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          (in_stack_ffffffffffffff10,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        local_1c = uVar2 + local_1c;
        this->__isset = (_SchemaElement__isset)((ushort)this->__isset & 0xfffd | 2);
      }
      else {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::skip
                          (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        local_1c = uVar2 + local_1c;
      }
      break;
    case 3:
      if (local_44 == 8) {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          (in_stack_ffffffffffffff10,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        local_1c = uVar2 + local_1c;
        this->repetition_type = local_60;
        this->__isset = (_SchemaElement__isset)((ushort)this->__isset & 0xfffb | 4);
      }
      else {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::skip
                          (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        local_1c = uVar2 + local_1c;
      }
      break;
    case 4:
      if (local_44 == 0xb) {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::readString
                          (in_stack_ffffffffffffff10,
                           (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        local_1c = uVar2 + local_1c;
        bVar1 = true;
      }
      else {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::skip
                          (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        local_1c = uVar2 + local_1c;
      }
      break;
    case 5:
      if (local_44 == 8) {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          (in_stack_ffffffffffffff10,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        local_1c = uVar2 + local_1c;
        this->__isset = (_SchemaElement__isset)((ushort)this->__isset & 0xfff7 | 8);
      }
      else {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::skip
                          (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        local_1c = uVar2 + local_1c;
      }
      break;
    case 6:
      if (local_44 == 8) {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          (in_stack_ffffffffffffff10,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        local_1c = uVar2 + local_1c;
        this->converted_type = local_64;
        this->__isset = (_SchemaElement__isset)((ushort)this->__isset & 0xffef | 0x10);
      }
      else {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::skip
                          (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        local_1c = uVar2 + local_1c;
      }
      break;
    case 7:
      if (local_44 == 8) {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          (in_stack_ffffffffffffff10,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        local_1c = uVar2 + local_1c;
        this->__isset = (_SchemaElement__isset)((ushort)this->__isset & 0xffdf | 0x20);
      }
      else {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::skip
                          (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        local_1c = uVar2 + local_1c;
      }
      break;
    case 8:
      if (local_44 == 8) {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          (in_stack_ffffffffffffff10,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        local_1c = uVar2 + local_1c;
        this->__isset = (_SchemaElement__isset)((ushort)this->__isset & 0xffbf | 0x40);
      }
      else {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::skip
                          (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        local_1c = uVar2 + local_1c;
      }
      break;
    case 9:
      if (local_44 == 8) {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::readI32
                          (in_stack_ffffffffffffff10,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
        ;
        local_1c = uVar2 + local_1c;
        this->__isset = (_SchemaElement__isset)((ushort)this->__isset & 0xff7f | 0x80);
      }
      else {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::skip
                          (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        local_1c = uVar2 + local_1c;
      }
      break;
    case 10:
      if (local_44 == 0xc) {
        sVar4 = LogicalType::read(&this->logicalType,(int)local_10,__buf_00,0xa9cab8);
        local_1c = (int)sVar4 + local_1c;
        this->__isset = (_SchemaElement__isset)((ushort)this->__isset & 0xfeff | 0x100);
      }
      else {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::skip
                          (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        local_1c = uVar2 + local_1c;
      }
      break;
    default:
      in_stack_ffffffffffffff24 =
           duckdb_apache::thrift::protocol::TProtocol::skip
                     (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      local_1c = in_stack_ffffffffffffff24 + local_1c;
    }
    in_stack_ffffffffffffff20 =
         duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x6ffd1b);
    local_1c = in_stack_ffffffffffffff20 + local_1c;
  }
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x6ffd45);
  uVar3 = uVar2 + local_1c;
  local_1c = uVar3;
  if (bVar1) {
    std::__cxx11::string::~string(local_40);
    duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
              ((TInputRecursionTracker *)0x6ffde7);
    return (ulong)uVar3;
  }
  this_00 = (TProtocolException *)__cxa_allocate_exception(0x30);
  duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
            (this_00,in_stack_ffffffffffffff0c);
  __cxa_throw(this_00,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
              duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
}

Assistant:

uint32_t SchemaElement::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_name = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast54;
          xfer += iprot->readI32(ecast54);
          this->type = static_cast<Type::type>(ecast54);
          this->__isset.type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->type_length);
          this->__isset.type_length = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast55;
          xfer += iprot->readI32(ecast55);
          this->repetition_type = static_cast<FieldRepetitionType::type>(ecast55);
          this->__isset.repetition_type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->name);
          isset_name = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->num_children);
          this->__isset.num_children = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast56;
          xfer += iprot->readI32(ecast56);
          this->converted_type = static_cast<ConvertedType::type>(ecast56);
          this->__isset.converted_type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->scale);
          this->__isset.scale = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->precision);
          this->__isset.precision = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 9:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->field_id);
          this->__isset.field_id = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 10:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->logicalType.read(iprot);
          this->__isset.logicalType = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_name)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}